

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlkf.cpp
# Opt level: O0

void __thiscall
icu_63::LocaleKeyFactory::updateVisibleIDs
          (LocaleKeyFactory *this,Hashtable *result,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  UnicodeString *id;
  UHashElement *pUStack_38;
  int32_t pos;
  UHashElement *elem;
  Hashtable *pHStack_28;
  UBool visible;
  Hashtable *supported;
  UErrorCode *status_local;
  Hashtable *result_local;
  LocaleKeyFactory *this_local;
  
  supported = (Hashtable *)status;
  status_local = (UErrorCode *)result;
  result_local = (Hashtable *)this;
  iVar2 = (*(this->super_ICUServiceFactory).super_UObject._vptr_UObject[8])(this,status);
  pHStack_28 = (Hashtable *)CONCAT44(extraout_var,iVar2);
  if (pHStack_28 != (Hashtable *)0x0) {
    elem._7_1_ = (this->_coverage & 1U) == 0;
    pUStack_38 = (UHashElement *)0x0;
    id._4_4_ = 0xffffffff;
    do {
      while( true ) {
        pUStack_38 = Hashtable::nextElement(pHStack_28,(int32_t *)((long)&id + 4));
        if (pUStack_38 == (UHashElement *)0x0) {
          return;
        }
        if (elem._7_1_ != '\0') break;
        Hashtable::remove((Hashtable *)status_local,(char *)(pUStack_38->key).pointer);
      }
      Hashtable::put((Hashtable *)status_local,(UnicodeString *)(pUStack_38->key).pointer,this,
                     (UErrorCode *)supported);
      UVar1 = ::U_FAILURE(*(UErrorCode *)&supported->hash);
    } while (UVar1 == '\0');
  }
  return;
}

Assistant:

void
LocaleKeyFactory::updateVisibleIDs(Hashtable& result, UErrorCode& status) const {
    const Hashtable* supported = getSupportedIDs(status);
    if (supported) {
        UBool visible = (_coverage & 0x1) == 0;
        const UHashElement* elem = NULL;
        int32_t pos = UHASH_FIRST;
        while ((elem = supported->nextElement(pos)) != NULL) {
            const UnicodeString& id = *((const UnicodeString*)elem->key.pointer);
            if (!visible) {
                result.remove(id);
            } else {
                result.put(id, (void*)this, status); // this is dummy non-void marker used for set semantics
                if (U_FAILURE(status)) {
                    break;
                }
            }
        }
    }
}